

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

int lest::repeat(text *opt,text *arg)

{
  int iVar1;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  text local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)arg);
  iVar1 = stoi(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  if (-2 < iVar1) {
    return iVar1;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&bStack_c8,"expecting \'-1\' or positive number with option \'",opt);
  std::operator+(&local_a8,&bStack_c8,"\', got \'");
  std::operator+(&local_88,&local_a8,arg);
  std::operator+(&local_68,&local_88,"\' (try option --help)");
  std::runtime_error::runtime_error(this,(string *)&local_68);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline int repeat( text opt, text arg )
{
    const int num = lest::stoi( arg );

    if ( indefinite( num ) || num >= 0 )
        return num;

    throw std::runtime_error( "expecting '-1' or positive number with option '" + opt + "', got '" + arg + "' (try option --help)" );
}